

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64InstPrinter.c
# Opt level: O0

void printAdrpLabel(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  cs_ac_type cVar4;
  MCOperand *op;
  int64_t iVar5;
  cs_struct *h;
  uint in_ESI;
  MCInst *in_RDI;
  uint8_t access;
  uint64_t imm;
  MCOperand *Op;
  uint64_t in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  
  op = MCInst_getOperand(in_RDI,in_ESI);
  _Var3 = MCOperand_isImm(op);
  if (_Var3) {
    iVar5 = MCOperand_getImm(op);
    h = (cs_struct *)(iVar5 * 0x1000 + (in_RDI->address & 0xfffffffffffff000));
    printUInt64Bang((SStream *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                    in_stack_ffffffffffffffc8);
    if (in_RDI->csh->detail != CS_OPT_OFF) {
      MCInst_getOpcode(in_RDI);
      cVar4 = get_op_access(h,in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0);
      in_RDI->flat_insn->detail->groups
      [(ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x45] = (uint8_t)cVar4;
      in_RDI->ac_idx = in_RDI->ac_idx + '\x01';
      puVar1 = in_RDI->flat_insn->detail->groups +
               (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x2d;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      *(cs_struct **)
       (in_RDI->flat_insn->detail->groups +
       (ulong)(in_RDI->flat_insn->detail->field_6).x86.opcode[2] * 0x38 + 0x35) = h;
      pcVar2 = in_RDI->flat_insn->detail;
      (pcVar2->field_6).x86.opcode[2] = (pcVar2->field_6).x86.opcode[2] + '\x01';
    }
  }
  return;
}

Assistant:

static void printAdrpLabel(MCInst *MI, unsigned OpNum, SStream *O)
{
	MCOperand *Op = MCInst_getOperand(MI, OpNum);

	if (MCOperand_isImm(Op)) {
		// ADRP sign extends a 21-bit offset, shifts it left by 12
		// and adds it to the value of the PC with its bottom 12 bits cleared
		uint64_t imm = (MCOperand_getImm(Op) * 0x1000) + (MI->address & ~0xfff);
		printUInt64Bang(O, imm);

		if (MI->csh->detail) {
#ifndef CAPSTONE_DIET
			uint8_t access;
			access = get_op_access(MI->csh, MCInst_getOpcode(MI), MI->ac_idx);
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].access = access;
			MI->ac_idx++;
#endif
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].type = ARM64_OP_IMM;
			MI->flat_insn->detail->arm64.operands[MI->flat_insn->detail->arm64.op_count].imm = imm;
			MI->flat_insn->detail->arm64.op_count++;
		}
		return;
	}
}